

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leb128.cc
# Opt level: O0

void wabt::WriteFixedU32Leb128(Stream *stream,uint32_t value,char *desc)

{
  Offset size;
  Offset length;
  char *pcStack_20;
  uint8_t data [5];
  char *desc_local;
  uint32_t value_local;
  Stream *stream_local;
  
  pcStack_20 = desc;
  size = WriteFixedU32Leb128Raw
                   ((uint8_t *)((long)&length + 3),(uint8_t *)&stack0xffffffffffffffe0,value);
  Stream::WriteData(stream,(void *)((long)&length + 3),size,pcStack_20,No);
  return;
}

Assistant:

void WriteFixedU32Leb128(Stream* stream, uint32_t value, const char* desc) {
  uint8_t data[MAX_U32_LEB128_BYTES];
  Offset length =
      WriteFixedU32Leb128Raw(data, data + MAX_U32_LEB128_BYTES, value);
  stream->WriteData(data, length, desc);
}